

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

int __thiscall
CConsole::ParseCommandArgs
          (CConsole *this,char *pArgs,char *pFormat,FCommandCallback pfnCallback,void *pContext)

{
  char *dst;
  long lVar1;
  int iVar2;
  CConsole *this_00;
  long in_FS_OFFSET;
  CResult Result;
  
  Result.m_apArgs[1] = (char *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  dst = Result.m_aStringStorage;
  Result.super_IResult.m_NumArgs = 0;
  Result.super_IResult._vptr_IResult = (_func_int **)&PTR__IResult_002156c0;
  mem_zero(dst,0x401);
  Result.m_pArgsStart = (char *)0x0;
  Result.m_pCommand = (char *)0x0;
  mem_zero(Result.m_apArgs,0x1000);
  this_00 = (CConsole *)dst;
  str_copy(dst,pArgs,0x401);
  Result.m_pArgsStart = dst;
  iVar2 = ParseArgs(this_00,&Result,pFormat);
  if ((iVar2 == 0) && (iVar2 = 0, pfnCallback != (FCommandCallback)0x0)) {
    (*pfnCallback)(&Result.super_IResult,pContext);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CConsole::ParseCommandArgs(const char *pArgs, const char *pFormat, FCommandCallback pfnCallback, void *pContext)
{
	CResult Result;
	str_copy(Result.m_aStringStorage, pArgs, sizeof(Result.m_aStringStorage));
	Result.m_pArgsStart = Result.m_aStringStorage;

	int Error = ParseArgs(&Result, pFormat);
	if(Error)
		return Error;

	if(pfnCallback)
		pfnCallback(&Result, pContext);

	return 0;
}